

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O2

Node * __thiscall
Parser::createCallNode
          (Parser *this,Token *t,Node *function,vector<Node_*,_std::allocator<Node_*>_> *params)

{
  pointer ppNVar1;
  Node *this_00;
  long lVar2;
  size_t i;
  ulong uVar3;
  Node *function_local;
  
  if (function == (Node *)0x0) {
    this_00 = (Node *)0x0;
  }
  else {
    function_local = function;
    this_00 = (Node *)operator_new(0x30);
    Node::Node(this_00,this->ctx,t);
    this_00->nodeType = PNT_FUNCTION_CALL;
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&this_00->children,&function_local);
    lVar2 = 0;
    for (uVar3 = 0;
        ppNVar1 = (params->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(params->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3);
        uVar3 = uVar3 + 1) {
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                (&this_00->children,(value_type *)((long)ppNVar1 + lVar2));
      lVar2 = lVar2 + 8;
    }
  }
  return this_00;
}

Assistant:

Node * createCallNode(Token & t, Node * function, vector<Node *> & params)
  {
    if (!function)
      return nullptr;

    Node * n = new Node(ctx, t);
    n->nodeType = PNT_FUNCTION_CALL;
    n->children.push_back(function);
    for (size_t i = 0; i < params.size(); i++)
      n->children.push_back(params[i]);
    return n;
  }